

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

bool Assimp::SkipSpaces<char>(char *in,char **out)

{
  bool bVar1;
  char **out_local;
  char *in_local;
  
  out_local = (char **)in;
  while( true ) {
    bVar1 = true;
    if (*(char *)out_local != ' ') {
      bVar1 = *(char *)out_local == '\t';
    }
    if (!bVar1) break;
    out_local = (char **)((long)out_local + 1);
  }
  *out = (char *)out_local;
  bVar1 = IsLineEnd<char>(*(char *)out_local);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

AI_FORCE_INLINE
bool SkipSpaces( const char_t* in, const char_t** out) {
    while( *in == ( char_t )' ' || *in == ( char_t )'\t' ) {
        ++in;
    }
    *out = in;
    return !IsLineEnd<char_t>(*in);
}